

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugIn.cpp
# Opt level: O3

void OpenSteer::PlugIn::sortBySelectionOrder(void)

{
  PlugIn *pPVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  
  if (1 < itemsInRegistry) {
    lVar3 = 1;
    lVar5 = 0;
    iVar2 = itemsInRegistry;
    do {
      lVar6 = lVar5 + 1;
      lVar4 = lVar3;
      if (lVar6 < iVar2) {
        do {
          (*(registry[lVar5]->super_AbstractPlugIn)._vptr_AbstractPlugIn[8])();
          (*(registry[lVar4]->super_AbstractPlugIn)._vptr_AbstractPlugIn[8])();
          if (extraout_XMM0_Da_00 < extraout_XMM0_Da) {
            pPVar1 = registry[lVar5];
            registry[lVar5] = registry[lVar4];
            registry[lVar4] = pPVar1;
          }
          lVar4 = lVar4 + 1;
          iVar2 = itemsInRegistry;
        } while ((int)lVar4 < itemsInRegistry);
      }
      lVar3 = lVar3 + 1;
      lVar5 = lVar6;
    } while (lVar6 < iVar2 + -1);
  }
  return;
}

Assistant:

void 
OpenSteer::PlugIn::sortBySelectionOrder (void)
{
    // I know, I know, just what the world needs:
    // another inline shell sort implementation...

    // starting at each of the first n-1 elements of the array
    for (int i = 0; i < itemsInRegistry-1; i++)
    {
        // scan over subsequent pairs, swapping if larger value is first
        for (int j = i+1; j < itemsInRegistry; j++)
        {
            const float iKey = registry[i]->selectionOrderSortKey ();
            const float jKey = registry[j]->selectionOrderSortKey ();

            if (iKey > jKey)
            {
                PlugIn* temporary = registry[i];
                registry[i] = registry[j];
                registry[j] = temporary;
            }
        }
    }
}